

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlers.hpp
# Opt level: O0

void __thiscall
Handlers::packet_handler_register_helper<(PacketFamily)13>::Register
          (packet_handler_register_helper<(PacketFamily)13> *this,PacketAction action,
          character_handler_t f,unsigned_short allow_states,double delay)

{
  packet_handler handler;
  packet_handler_register *this_00;
  packet_handler local_48;
  double local_30;
  double delay_local;
  character_handler_t p_Stack_20;
  unsigned_short allow_states_local;
  character_handler_t f_local;
  packet_handler_register_helper<(PacketFamily)13> *ppStack_10;
  PacketAction action_local;
  packet_handler_register_helper<(PacketFamily)13> *this_local;
  
  this_00 = packet_handler_register_instance;
  local_30 = delay;
  delay_local._6_2_ = allow_states;
  p_Stack_20 = f;
  f_local._7_1_ = action;
  ppStack_10 = this;
  packet_handler::packet_handler(&local_48,CharacterFn,(void_fn_t)f,allow_states,delay);
  handler.delay = local_48.delay;
  handler.fn_type = local_48.fn_type;
  handler.allow_states = local_48.allow_states;
  handler._6_2_ = local_48._6_2_;
  handler.f = local_48.f;
  packet_handler_register::Register(this_00,PACKET_SHOP,action,handler);
  return;
}

Assistant:

void Register(PacketAction action, character_handler_t f, unsigned short allow_states, double delay = 0.0) const
		{
			packet_handler_register_instance->Register(family, action, packet_handler(packet_handler::CharacterFn, reinterpret_cast<void_fn_t>(f), allow_states, delay));
		}